

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmbbt.c
# Opt level: O3

void bitblt(DLword *srcbase,DLword *dstbase,int sx,int dx,int w,int h,int srcbpl,int dstbpl,
           int backwardflg,int src_comp,int op,int gray,int num_gray,int curr_gray_line)

{
  DLword *pDVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  sbyte sVar6;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  long lVar18;
  uint *puVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint *puVar28;
  uint *puVar29;
  uint *puVar30;
  uint uVar31;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint *local_a8;
  DLword *local_a0;
  uint local_94;
  uint local_90;
  uint local_8c;
  int local_7c;
  uint *local_78;
  sbyte sVar7;
  
  if (gray == 0) {
    local_b0 = dstbpl | srcbpl;
    if (backwardflg == 0) {
      if (dx < 0) {
        uVar5 = -(ulong)(7U - dx >> 3);
      }
      else {
        uVar5 = (ulong)((uint)dx >> 3);
      }
      local_a8 = (uint *)((long)dstbase + uVar5);
      uVar16 = (dx & 7U) + ((uint)local_a8 & 3) * 8;
      local_b4 = (w + uVar16) - 1 & 0x1f;
      local_d0 = -1 << (~(byte)local_b4 & 0x1f);
      local_cc = -(uint)(uVar16 == 0) | ~(-1 << (-(char)uVar16 & 0x1fU));
      if (sx < 0) {
        uVar5 = -(ulong)(7U - sx >> 3);
      }
      else {
        uVar5 = (ulong)((uint)sx >> 3);
      }
      local_b8 = local_d0 & local_cc;
      local_c8 = ((int)(uVar16 + w) >> 5) - 1;
      local_78 = (uint *)(uVar5 + (long)srcbase & 0xfffffffffffffffc);
      uVar10 = (sx & 7U) + ((uint)(uVar5 + (long)srcbase) & 3) * 8;
      local_8c = (w + uVar10) - 1 & 0x1f;
      uVar4 = uVar10 - uVar16 & 0x1f;
      local_90 = uVar16 - uVar10 & 0x1f;
      local_94 = -(uint)(uVar4 == 0) | ~(-1 << (sbyte)uVar4);
    }
    else {
      uVar16 = (w + dx) - 1;
      if (w + dx < 1) {
        uVar5 = -(ulong)(8U - (w + dx) >> 3);
      }
      else {
        uVar5 = (ulong)(uVar16 >> 3);
      }
      local_a8 = (uint *)((long)dstbase + uVar5);
      local_b4 = (uVar16 & 7) + ((uint)local_a8 & 3) * 8;
      iVar23 = local_b4 - w;
      uVar16 = iVar23 + 1U & 0x1f;
      local_cc = -1 << (~(byte)local_b4 & 0x1f);
      local_d0 = -(uint)(uVar16 == 0) | ~(-1 << (-(char)uVar16 & 0x1fU));
      uVar10 = (local_b4 ^ 0xffffffff) + w;
      local_c8 = uVar10 >> 5;
      if ((int)uVar10 < 1) {
        local_c8 = 0;
      }
      uVar10 = (w + sx) - 1;
      if (w + sx < 1) {
        uVar5 = -(ulong)(8U - (w + sx) >> 3);
      }
      else {
        uVar5 = (ulong)(uVar10 >> 3);
      }
      local_b8 = local_d0 & local_cc;
      local_78 = (uint *)(uVar5 + (long)srcbase & 0xfffffffffffffffc);
      local_8c = (uVar10 & 7) + ((uint)(uVar5 + (long)srcbase) & 3) * 8;
      iVar14 = local_8c - w;
      uVar10 = iVar14 + 1U & 0x1f;
      local_90 = iVar23 - iVar14 & 0x1f;
      uVar4 = iVar14 - iVar23 & 0x1f;
      local_94 = ~(-1 << (sbyte)uVar4);
    }
  }
  else {
    if (dx < 0) {
      uVar5 = -(ulong)(7U - dx >> 3);
    }
    else {
      uVar5 = (ulong)((uint)dx >> 3);
    }
    local_a8 = (uint *)((long)dstbase + uVar5);
    uVar16 = (dx & 7U) + ((uint)local_a8 & 3) * 8;
    local_b4 = (w + uVar16) - 1 & 0x1f;
    uVar4 = 0;
    local_d0 = -1 << (~(byte)local_b4 & 0x1f);
    local_cc = -(uint)(uVar16 == 0) | ~(-1 << (-(char)uVar16 & 0x1fU));
    local_b8 = local_d0 & local_cc;
    local_c8 = ((int)(uVar16 + w) >> 5) - 1;
    uVar10 = sx & 0xf;
    local_94 = 0;
    local_8c = 0;
    local_b0 = dstbpl;
    local_78 = (uint *)0x0;
    local_90 = 0;
  }
  if (h < 1) {
    return;
  }
  local_7c = curr_gray_line;
  local_a8 = (uint *)((ulong)local_a8 & 0xfffffffffffffffc);
  uVar3 = -(uint)(src_comp != 0);
  lVar9 = (long)(dstbpl >> 5);
  uVar22 = 0;
  puVar30 = local_78;
  local_a0 = srcbase;
LAB_0010a8a9:
  local_bc = local_b8;
  local_c4 = local_d0;
  local_ac = local_cc;
  puVar17 = local_78;
  puVar29 = local_a8;
  iVar23 = h;
  uVar24 = local_90;
  uVar11 = local_8c;
  uVar27 = local_b4;
  uVar21 = local_94;
  uVar31 = uVar16;
  uVar12 = uVar10;
  uVar8 = local_c8;
  do {
    puVar19 = puVar29;
    uVar13 = local_bc;
    if (gray == 0) {
      sVar6 = (sbyte)uVar24;
      sVar7 = (sbyte)uVar4;
      if (backwardflg == 0) {
        uVar15 = *puVar30;
        if ((int)(uVar12 + w) < 0x21 || uVar12 <= uVar31) {
          puVar30 = puVar30 + 1;
          if (uVar31 < uVar12) {
            uVar26 = uVar15 << sVar7;
          }
          else {
            uVar26 = uVar15 >> sVar6 & uVar21;
            uVar22 = ~uVar21 & uVar15 << sVar7;
          }
        }
        else {
          puVar28 = puVar30 + 1;
          puVar30 = puVar30 + 2;
          uVar26 = *puVar28 >> sVar6 & uVar21 | uVar15 << sVar7;
          uVar22 = ~uVar21 & *puVar28 << sVar7;
        }
        uVar26 = uVar26 ^ uVar3;
        if ((int)(w + uVar31) < 0x21) goto LAB_0010abb7;
        uVar13 = *puVar29;
        uVar15 = uVar13;
        switch(op) {
        case 0:
          break;
        case 1:
          uVar26 = uVar26 & uVar13;
          break;
        case 2:
          uVar26 = uVar26 | uVar13;
          break;
        case 3:
          uVar26 = uVar26 ^ uVar13;
          break;
        default:
          goto switchD_0010ae24_default;
        }
        uVar15 = uVar26;
switchD_0010ae24_default:
        *puVar29 = uVar15 & local_ac | uVar13 & ~local_ac;
        puVar19 = puVar29 + 1;
        if (uVar12 == uVar31) {
          if (src_comp == 0) {
            switch(op) {
            case 0:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  uVar15 = *puVar30;
                  puVar30 = puVar30 + 1;
                  *puVar19 = uVar15;
                  puVar19 = puVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 1:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 & *puVar30;
                  puVar30 = puVar30 + 1;
                  puVar19 = puVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 2:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 | *puVar30;
                  puVar30 = puVar30 + 1;
                  puVar19 = puVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 3:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 ^ *puVar30;
                  puVar30 = puVar30 + 1;
                  puVar19 = puVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
            }
          }
          else {
            switch(op) {
            case 0:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  uVar15 = *puVar30;
                  puVar30 = puVar30 + 1;
                  *puVar19 = ~uVar15;
                  puVar19 = puVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 1:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 & ~*puVar30;
                  puVar30 = puVar30 + 1;
                  puVar19 = puVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 2:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 | ~*puVar30;
                  puVar30 = puVar30 + 1;
                  puVar19 = puVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 3:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  uVar15 = *puVar30;
                  puVar30 = puVar30 + 1;
                  *puVar19 = ~(uVar15 ^ *puVar19);
                  puVar19 = puVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
            }
          }
        }
        else if (src_comp == 0) {
          switch(op) {
          case 0:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + 1;
                uVar26 = uVar15 >> sVar6 | uVar22;
                uVar22 = uVar15 << sVar7;
                *puVar19 = uVar26;
                puVar19 = puVar19 + 1;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            break;
          case 1:
            if (0 < (int)uVar8) {
              uVar15 = uVar8 + 1;
              uVar13 = uVar22;
              do {
                uVar26 = *puVar30;
                puVar30 = puVar30 + 1;
                uVar22 = uVar26 << sVar7;
                *puVar19 = *puVar19 & (uVar26 >> sVar6 | uVar13);
                puVar19 = puVar19 + 1;
                uVar15 = uVar15 - 1;
                uVar13 = uVar22;
              } while (1 < uVar15);
            }
            break;
          case 2:
            if (0 < (int)uVar8) {
              uVar15 = uVar8 + 1;
              puVar28 = puVar19;
              uVar13 = uVar22;
              do {
                uVar26 = *puVar30;
                puVar30 = puVar30 + 1;
                uVar22 = uVar26 << sVar7;
                puVar19 = puVar28 + 1;
                *puVar28 = uVar13 | *puVar28 | uVar26 >> sVar6;
                uVar15 = uVar15 - 1;
                puVar28 = puVar19;
                uVar13 = uVar22;
              } while (1 < uVar15);
            }
            break;
          case 3:
            if (0 < (int)uVar8) {
              uVar15 = uVar8 + 1;
              uVar13 = uVar22;
              do {
                uVar26 = *puVar30;
                puVar30 = puVar30 + 1;
                uVar22 = uVar26 << sVar7;
                *puVar19 = *puVar19 ^ (uVar26 >> sVar6 | uVar13);
                puVar19 = puVar19 + 1;
                uVar15 = uVar15 - 1;
                uVar13 = uVar22;
              } while (1 < uVar15);
            }
          }
        }
        else {
          switch(op) {
          case 0:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + 1;
                uVar26 = uVar15 >> sVar6 | uVar22;
                uVar22 = uVar15 << sVar7;
                *puVar19 = ~uVar26;
                puVar19 = puVar19 + 1;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            break;
          case 1:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + 1;
                uVar26 = uVar15 >> sVar6 | uVar22;
                uVar22 = uVar15 << sVar7;
                *puVar19 = *puVar19 & ~uVar26;
                puVar19 = puVar19 + 1;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            break;
          case 2:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + 1;
                uVar26 = uVar15 >> sVar6 | uVar22;
                uVar22 = uVar15 << sVar7;
                *puVar19 = *puVar19 | ~uVar26;
                puVar19 = puVar19 + 1;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            break;
          case 3:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              puVar28 = puVar19;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + 1;
                uVar26 = uVar15 >> sVar6 | uVar22;
                uVar22 = uVar15 << sVar7;
                puVar19 = puVar28 + 1;
                *puVar28 = ~(uVar26 ^ *puVar28);
                uVar13 = uVar13 - 1;
                puVar28 = puVar19;
              } while (1 < uVar13);
            }
          }
        }
        if (uVar27 == 0x1f) goto LAB_0010abff;
        uVar26 = uVar22;
        if (uVar11 <= uVar27) {
          uVar13 = *puVar30 >> sVar6 & uVar21;
          goto LAB_0010b730;
        }
      }
      else {
        if (uVar11 < uVar27) {
          uVar26 = *puVar30 >> sVar6 & uVar21;
          if ((int)(uVar31 + 1) < (int)(w + uVar12)) {
            uVar22 = puVar30[-1];
            puVar30 = puVar30 + -2;
            uVar26 = uVar26 | uVar22 << sVar7;
            goto LAB_0010aa68;
          }
          puVar30 = puVar30 + -1;
        }
        else {
          uVar22 = *puVar30;
          puVar30 = puVar30 + -1;
          uVar26 = uVar22 << sVar7;
LAB_0010aa68:
          uVar22 = uVar22 >> sVar6 & uVar21;
        }
        uVar26 = uVar26 ^ uVar3;
        if ((int)(w + uVar31) < 0x21) goto LAB_0010abb7;
        uVar13 = *puVar29;
        uVar15 = uVar13;
        switch(op) {
        case 0:
          break;
        case 1:
          uVar26 = uVar26 & uVar13;
          break;
        case 2:
          uVar26 = uVar26 | uVar13;
          break;
        case 3:
          uVar26 = uVar26 ^ uVar13;
          break;
        default:
          goto switchD_0010ab75_default;
        }
        uVar15 = uVar26;
switchD_0010ab75_default:
        *puVar29 = uVar15 & local_ac | uVar13 & ~local_ac;
        puVar19 = puVar29 + -1;
        if (uVar12 == uVar31) {
          if (src_comp == 0) {
            switch(op) {
            case 0:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  uVar15 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar19 = uVar15;
                  puVar19 = puVar19 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 1:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 & *puVar30;
                  puVar30 = puVar30 + -1;
                  puVar19 = puVar19 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 2:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 | *puVar30;
                  puVar30 = puVar30 + -1;
                  puVar19 = puVar19 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 3:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 ^ *puVar30;
                  puVar30 = puVar30 + -1;
                  puVar19 = puVar19 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
            }
          }
          else {
            switch(op) {
            case 0:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  uVar15 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar19 = ~uVar15;
                  puVar19 = puVar19 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 1:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 & ~*puVar30;
                  puVar30 = puVar30 + -1;
                  puVar19 = puVar19 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 2:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  *puVar19 = *puVar19 | ~*puVar30;
                  puVar30 = puVar30 + -1;
                  puVar19 = puVar19 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
              break;
            case 3:
              if (0 < (int)uVar8) {
                uVar13 = uVar8 + 1;
                do {
                  uVar15 = *puVar30;
                  puVar30 = puVar30 + -1;
                  *puVar19 = ~(uVar15 ^ *puVar19);
                  puVar19 = puVar19 + -1;
                  uVar13 = uVar13 - 1;
                } while (1 < uVar13);
              }
            }
          }
        }
        else if (src_comp == 0) {
          switch(op) {
          case 0:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar26 = uVar15 << sVar7 | uVar22;
                uVar22 = uVar15 >> sVar6;
                *puVar19 = uVar26;
                puVar19 = puVar19 + -1;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            break;
          case 1:
            if (0 < (int)uVar8) {
              uVar15 = uVar8 + 1;
              uVar13 = uVar22;
              do {
                uVar26 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar22 = uVar26 >> sVar6;
                *puVar19 = *puVar19 & (uVar26 << sVar7 | uVar13);
                puVar19 = puVar19 + -1;
                uVar15 = uVar15 - 1;
                uVar13 = uVar22;
              } while (1 < uVar15);
            }
            break;
          case 2:
            if (0 < (int)uVar8) {
              uVar15 = uVar8 + 1;
              puVar28 = puVar19;
              uVar13 = uVar22;
              do {
                uVar26 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar22 = uVar26 >> sVar6;
                puVar19 = puVar28 + -1;
                *puVar28 = uVar13 | *puVar28 | uVar26 << sVar7;
                uVar15 = uVar15 - 1;
                puVar28 = puVar19;
                uVar13 = uVar22;
              } while (1 < uVar15);
            }
            break;
          case 3:
            if (0 < (int)uVar8) {
              uVar15 = uVar8 + 1;
              uVar13 = uVar22;
              do {
                uVar26 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar22 = uVar26 >> sVar6;
                *puVar19 = *puVar19 ^ (uVar26 << sVar7 | uVar13);
                puVar19 = puVar19 + -1;
                uVar15 = uVar15 - 1;
                uVar13 = uVar22;
              } while (1 < uVar15);
            }
          }
        }
        else {
          switch(op) {
          case 0:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar26 = uVar15 << sVar7 | uVar22;
                uVar22 = uVar15 >> sVar6;
                *puVar19 = ~uVar26;
                puVar19 = puVar19 + -1;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            break;
          case 1:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar26 = uVar15 << sVar7 | uVar22;
                uVar22 = uVar15 >> sVar6;
                *puVar19 = *puVar19 & ~uVar26;
                puVar19 = puVar19 + -1;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            break;
          case 2:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar26 = uVar15 << sVar7 | uVar22;
                uVar22 = uVar15 >> sVar6;
                *puVar19 = *puVar19 | ~uVar26;
                puVar19 = puVar19 + -1;
                uVar13 = uVar13 - 1;
              } while (1 < uVar13);
            }
            break;
          case 3:
            if (0 < (int)uVar8) {
              uVar13 = uVar8 + 1;
              puVar28 = puVar19;
              do {
                uVar15 = *puVar30;
                puVar30 = puVar30 + -1;
                uVar26 = uVar15 << sVar7 | uVar22;
                uVar22 = uVar15 >> sVar6;
                puVar19 = puVar28 + -1;
                *puVar28 = ~(uVar26 ^ *puVar28);
                uVar13 = uVar13 - 1;
                puVar28 = puVar19;
              } while (1 < uVar13);
            }
          }
        }
        if (uVar31 == 0) goto LAB_0010abff;
        uVar26 = uVar22;
        if (uVar31 <= uVar12) {
          uVar13 = *puVar30 << sVar7;
LAB_0010b730:
          uVar26 = uVar13 | uVar22;
        }
      }
      uVar26 = uVar26 ^ uVar3;
      uVar13 = local_c4;
LAB_0010abb7:
      uVar15 = *puVar19;
      uVar20 = uVar15;
      switch(op) {
      case 0:
        break;
      case 1:
        uVar26 = uVar26 & uVar15;
        break;
      case 2:
        uVar26 = uVar26 | uVar15;
        break;
      case 3:
        uVar26 = uVar26 ^ uVar15;
        break;
      default:
        goto switchD_0010abdc_default;
      }
      uVar20 = uVar26;
switchD_0010abdc_default:
      *puVar19 = uVar15 & ~uVar13 | uVar20 & uVar13;
    }
    else {
      uVar4 = uVar12 - uVar31 & 0xf;
      uVar15 = CONCAT22(*local_a0,*local_a0) << (sbyte)uVar4;
      uVar26 = (uVar15 >> 0x10 | uVar15) ^ uVar3;
      if ((int)(w + uVar31) < 0x21) goto LAB_0010abb7;
      uVar13 = *puVar29;
      if ((uint)op < 4) {
        uVar15 = ~local_ac & uVar13;
        switch(op) {
        case 0:
          *puVar29 = uVar26 & local_ac | uVar15;
          puVar19 = puVar29 + 1;
          if (0 < (int)uVar8) {
            uVar13 = uVar8 + 1;
            do {
              *puVar19 = uVar26;
              puVar19 = puVar19 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          break;
        case 1:
          *puVar29 = uVar13 & uVar26 & local_ac | uVar15;
          puVar19 = puVar29 + 1;
          if (0 < (int)uVar8) {
            uVar13 = uVar8 + 1;
            do {
              *puVar19 = *puVar19 & uVar26;
              puVar19 = puVar19 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          break;
        case 2:
          *puVar29 = (uVar13 | uVar26) & local_ac | uVar15;
          puVar19 = puVar29 + 1;
          if (0 < (int)uVar8) {
            uVar13 = uVar8 + 1;
            do {
              *puVar19 = *puVar19 | uVar26;
              puVar19 = puVar19 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
          break;
        case 3:
          *puVar29 = (uVar13 ^ uVar26) & local_ac | uVar15;
          puVar19 = puVar29 + 1;
          if (0 < (int)uVar8) {
            uVar13 = uVar8 + 1;
            do {
              *puVar19 = *puVar19 ^ uVar26;
              puVar19 = puVar19 + 1;
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
          }
        }
      }
      else {
        *puVar29 = uVar13;
        puVar19 = puVar29 + 1;
      }
      uVar13 = local_c4;
      if (uVar27 != 0x1f) goto LAB_0010abb7;
    }
LAB_0010abff:
    if (gray != 0) break;
    lVar18 = lVar9;
    uVar5 = (long)(srcbpl >> 5);
    if (backwardflg == 0) {
      if ((local_b0 & 0x1f) != 0) {
        uVar15 = uVar31 + dstbpl;
        uVar31 = uVar15 & 0x1f;
        uVar27 = (uVar31 + w) - 1 & 0x1f;
        local_ac = -(uint)(uVar31 == 0) | ~(-1 << (-(char)uVar31 & 0x1fU));
        local_c4 = -1 << (~(byte)uVar27 & 0x1f);
        local_bc = local_c4 & local_ac;
        uVar8 = ((int)(uVar31 + w) >> 5) - 1;
        uVar13 = uVar12 + srcbpl;
        uVar12 = uVar13 & 0x1f;
        uVar11 = w + 0x1f + uVar13 & 0x1f;
        uVar24 = uVar15 - uVar13 & 0x1f;
        uVar4 = uVar13 - uVar15 & 0x1f;
        uVar21 = -(uint)(uVar4 == 0) | ~(-1 << (sbyte)uVar4);
        lVar18 = (long)((int)uVar15 >> 5);
        uVar5 = (long)((int)uVar13 >> 5);
      }
    }
    else if ((local_b0 & 0x1f) != 0) {
      uVar4 = uVar27 + dstbpl;
      lVar18 = -(ulong)(0x1f - uVar4 >> 5);
      if (-1 < (int)uVar4) {
        lVar18 = 0;
      }
      uVar27 = uVar4 & 0x1f;
      iVar14 = uVar4 - w;
      local_ac = -1 << (~(byte)uVar27 & 0x1f);
      uVar31 = iVar14 + 1U & 0x1f;
      local_c4 = -(uint)(uVar31 == 0) | ~(-1 << (-(char)uVar31 & 0x1fU));
      local_bc = local_c4 & local_ac;
      uVar4 = (uVar27 ^ 0xffffffff) + w;
      uVar8 = uVar4 >> 5;
      if ((int)uVar4 < 1) {
        uVar8 = 0;
      }
      uVar4 = uVar11 + srcbpl;
      uVar5 = (ulong)(uVar4 >> 5);
      if ((int)uVar4 < 0) {
        uVar5 = -(ulong)(0x1f - uVar4 >> 5);
      }
      uVar11 = uVar4 & 0x1f;
      iVar25 = uVar4 - w;
      uVar12 = iVar25 + 1U & 0x1f;
      uVar24 = iVar14 - iVar25 & 0x1f;
      uVar4 = iVar25 - iVar14 & 0x1f;
      uVar21 = ~(-1 << (sbyte)uVar4);
    }
    puVar29 = puVar29 + lVar18;
    puVar17 = puVar17 + uVar5;
    bVar2 = iVar23 < 2;
    puVar30 = puVar17;
    iVar23 = iVar23 + -1;
    if (bVar2) {
      return;
    }
  } while( true );
  lVar18 = lVar9;
  if ((local_b0 & 0x1f) != 0) {
    uVar8 = uVar16 + dstbpl;
    uVar16 = uVar8 & 0x1f;
    local_b4 = (uVar16 + w) - 1 & 0x1f;
    local_d0 = -1 << (~(byte)local_b4 & 0x1f);
    local_cc = -(uint)(uVar16 == 0) | ~(-1 << (-(char)uVar16 & 0x1fU));
    local_b8 = local_d0 & local_cc;
    local_c8 = ((int)(uVar16 + w) >> 5) - 1;
    lVar18 = (long)((int)uVar8 >> 5);
  }
  local_a8 = local_a8 + lVar18;
  iVar14 = local_7c + 1;
  pDVar1 = local_a0 + 1;
  local_7c = iVar14;
  if (num_gray <= iVar14) {
    local_7c = 0;
  }
  local_a0 = local_a0 + -(long)(num_gray + -1);
  if (iVar14 < num_gray) {
    local_a0 = pDVar1;
  }
  bVar2 = h < 2;
  h = iVar23 + -1;
  if (bVar2) {
    return;
  }
  goto LAB_0010a8a9;
}

Assistant:

void bitblt(DLword *srcbase, DLword *dstbase, int sx, int dx, int w, int h, int srcbpl, int dstbpl,
            int backwardflg, int src_comp, int op, int gray, int num_gray, int curr_gray_line) {
  new_bitblt_code;
}